

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

void __thiscall
QDBusMenuLayoutItem::populate
          (QDBusMenuLayoutItem *this,QDBusPlatformMenu *menu,int depth,QStringList *propertyNames)

{
  QDBusPlatformMenuItem **ppQVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  undefined1 *local_80;
  QVariantMap local_78;
  Data *pDStack_70;
  QDBusMenuLayoutItem *local_68;
  qsizetype qStack_60;
  QArrayDataPointer<QDBusPlatformMenuItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QDBusPlatformMenuItem **)&DAT_aaaaaaaaaaaaaaaa;
  QDBusPlatformMenu::items((QList<QDBusPlatformMenuItem_*> *)&local_58,(QDBusPlatformMenu *)menu);
  ppQVar1 = local_58.ptr;
  lVar3 = local_58.size << 3;
  for (lVar2 = 0; lVar3 != lVar2; lVar2 = lVar2 + 8) {
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QDBusMenuLayoutItem *)0x0;
    qStack_60 = 0;
    local_78.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
            )0x0;
    pDStack_70 = (Data *)0x0;
    populate((QDBusMenuLayoutItem *)&local_80,*(QDBusPlatformMenuItem **)((long)ppQVar1 + lVar2),
             depth + -1,propertyNames);
    QList<QDBusMenuLayoutItem>::emplaceBack<QDBusMenuLayoutItem_const&>
              (&this->m_children,(QDBusMenuLayoutItem *)&local_80);
    ~QDBusMenuLayoutItem((QDBusMenuLayoutItem *)&local_80);
  }
  QArrayDataPointer<QDBusPlatformMenuItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuLayoutItem::populate(const QDBusPlatformMenu *menu, int depth, const QStringList &propertyNames)
{
    const auto items = menu->items();
    for (QDBusPlatformMenuItem *item : items) {
        QDBusMenuLayoutItem child;
        child.populate(item, depth - 1, propertyNames);
        m_children << child;
    }
}